

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

quint16 qChecksum(QByteArrayView data,ChecksumType standard)

{
  ushort uVar1;
  int in_EDX;
  long in_FS_OFFSET;
  qsizetype len;
  uchar *p;
  uchar c;
  quint16 crc;
  long local_30;
  byte *local_28;
  ushort local_1e;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e = 0;
  if (in_EDX == 0) {
    local_1e = 0xffff;
  }
  else if (in_EDX == 1) {
    local_1e = 0x6363;
  }
  local_28 = (byte *)QByteArrayView::data(&local_18);
  local_30 = QByteArrayView::size(&local_18);
  while (local_30 != 0) {
    uVar1 = (ushort)((int)(uint)local_1e >> 4) ^
            crc_tbl[(int)(((uint)local_1e ^ (uint)*local_28) & 0xf)];
    local_1e = (ushort)((int)(uint)uVar1 >> 4) ^
               crc_tbl[(int)(((uint)uVar1 ^ (int)(uint)*local_28 >> 4) & 0xf)];
    local_30 = local_30 + -1;
    local_28 = local_28 + 1;
  }
  if (in_EDX == 0) {
    local_1e = local_1e ^ 0xffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1e;
  }
  __stack_chk_fail();
}

Assistant:

quint16 qChecksum(QByteArrayView data, Qt::ChecksumType standard)
{
    quint16 crc = 0x0000;
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = 0xffff;
        break;
    case Qt::ChecksumItuV41:
        crc = 0x6363;
        break;
    }
    uchar c;
    const uchar *p = reinterpret_cast<const uchar *>(data.data());
    qsizetype len = data.size();
    while (len--) {
        c = *p++;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
        c >>= 4;
        crc = ((crc >> 4) & 0x0fff) ^ crc_tbl[((crc ^ c) & 15)];
    }
    switch (standard) {
    case Qt::ChecksumIso3309:
        crc = ~crc;
        break;
    case Qt::ChecksumItuV41:
        break;
    }
    return crc & 0xffff;
}